

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O1

char duckdb::NumericCastImpl<char,_unsigned_int,_false>::Convert(uint val)

{
  size_type sVar1;
  InternalException *this;
  pointer __dest;
  size_type __dnew;
  size_type local_58;
  string local_50;
  
  if (val < 0x80) {
    return (char)val;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_58 = 0x4b;
  __dest = (pointer)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_58);
  sVar1 = local_58;
  local_50.field_2._M_allocated_capacity = local_58;
  local_50._M_dataplus._M_p = __dest;
  switchD_00b1422a::default
            (__dest,"Information loss on integer cast: value %d outside of target range [%d, %d]",
             0x4b);
  local_50._M_string_length = sVar1;
  __dest[sVar1] = '\0';
  InternalException::InternalException<unsigned_int,char,char>(this,&local_50,val,-0x80,'\x7f');
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static TO Convert(FROM val) {
		// some dance around signed-unsigned integer comparison below
		auto minval = NumericLimits<TO>::Minimum();
		auto maxval = NumericLimits<TO>::Maximum();
		auto unsigned_in = static_cast<typename MakeUnsigned<FROM>::type>(val);
		auto unsigned_min = static_cast<typename MakeUnsigned<TO>::type>(minval);
		auto unsigned_max = static_cast<typename MakeUnsigned<TO>::type>(maxval);
		auto signed_in = static_cast<typename MakeSigned<FROM>::type>(val);
		auto signed_min = static_cast<typename MakeSigned<TO>::type>(minval);
		auto signed_max = static_cast<typename MakeSigned<TO>::type>(maxval);

		if (!NumericLimits<FROM>::IsSigned() && !NumericLimits<TO>::IsSigned() &&
		    (unsigned_in < unsigned_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(unsigned_min), static_cast<TO>(unsigned_max));
		}

		if (NumericLimits<FROM>::IsSigned() && NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || signed_in > signed_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(signed_max));
		}

		if (NumericLimits<FROM>::IsSigned() != NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(unsigned_max));
		}

		return static_cast<TO>(val);
	}